

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O3

int __thiscall QuantizeData::update_histogram(QuantizeData *this,Mat *data)

{
  float fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  pointer pfVar5;
  uint uVar6;
  void *pvVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  
  iVar2 = data->c;
  if (0 < (long)iVar2) {
    uVar6 = data->h * data->w;
    pvVar7 = data->data;
    sVar3 = data->cstep;
    sVar4 = data->elemsize;
    lVar8 = 0;
    do {
      if (0 < (int)uVar6) {
        pfVar5 = (this->histogram).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = 0;
        do {
          fVar1 = *(float *)((long)pvVar7 + uVar9 * 4);
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            iVar10 = (int)(ABS(fVar1) / this->histogram_interval);
            if (0x7fe < iVar10) {
              iVar10 = 0x7ff;
            }
            pfVar5[iVar10] = pfVar5[iVar10] + 1.0;
          }
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
      }
      lVar8 = lVar8 + 1;
      pvVar7 = (void *)((long)pvVar7 + sVar3 * sVar4);
    } while (lVar8 != iVar2);
  }
  return 0;
}

Assistant:

int QuantizeData::update_histogram(ncnn::Mat data)
{
    int channel_num = data.c;
    int size = data.w * data.h;

    for (int q=0; q<channel_num; q++)
    {
        const float *data_n = data.channel(q);
        for(int i=0; i<size; i++)
        {
            if (data_n[i] == 0)
                continue;

            int index = std::min(static_cast<int>(std::abs(data_n[i]) / histogram_interval), 2047);

            histogram[index]++;
        }
    }        

    return 0;
}